

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcManager.cpp
# Opt level: O0

GrcEnv * __thiscall
GrcManager::PushTableEnv(GrcManager *this,GrpLineAndFile *lnf,string *staTableName)

{
  bool bVar1;
  GrcManager *this_00;
  Symbol pGVar2;
  size_type_conflict sVar3;
  GrcEnv *this_01;
  pointer ppVar4;
  string *in_RDX;
  GrcManager *in_RDI;
  iterator hmit;
  int nPass;
  GrcEnv *penvNew;
  pair<GrcSymbolTableEntry_*,_int> hmpair;
  int nPrevPass;
  Symbol psymPrevTable;
  GrcEnv *penvPrev;
  Symbol psymTable;
  GrpLineAndFile *in_stack_fffffffffffffec8;
  GrcManager *in_stack_fffffffffffffed0;
  vector<GrcEnv,_std::allocator<GrcEnv>_> *this_02;
  GrcSymbolTableEntry *in_stack_fffffffffffffed8;
  allocator *paVar5;
  _Self in_stack_ffffffffffffff08;
  _Self in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  int iVar6;
  GdlObject *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff31;
  pair<GrcSymbolTableEntry_*,_int> local_c8;
  int local_b4;
  Symbol local_b0;
  GrcEnv *local_a8;
  string local_a0 [39];
  allocator local_79;
  string local_78 [48];
  string local_48 [32];
  Symbol local_28;
  GrcEnv *local_8;
  
  iVar6 = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  this_00 = (GrcManager *)SymbolTable(in_RDI);
  std::__cxx11::string::string(local_48,in_RDX);
  pGVar2 = GrcSymbolTable::FindSymbol
                     ((GrcSymbolTable *)in_stack_ffffffffffffff10._M_node,
                      (string *)in_stack_ffffffffffffff08._M_node);
  std::__cxx11::string::~string(local_48);
  local_28 = pGVar2;
  if ((pGVar2 == (Symbol)0x0) ||
     (bVar1 = GrcSymbolTableEntry::FitsSymbolType
                        (in_stack_fffffffffffffed8,
                         (SymbolType)((ulong)in_stack_fffffffffffffed0 >> 0x20)), !bVar1)) {
    paVar5 = &local_79;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"Invalid table name: ",paVar5);
    std::__cxx11::string::string(local_a0,in_RDX);
    GrcErrorList::AddError
              ((GrcErrorList *)CONCAT71(in_stack_ffffffffffffff31,in_stack_ffffffffffffff30),iVar6,
               in_stack_ffffffffffffff20,
               (string *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
               (string *)in_stack_ffffffffffffff10._M_node,
               (GrpLineAndFile *)in_stack_ffffffffffffff08._M_node);
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    local_8 = PushGeneralEnv(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  }
  else {
    this_02 = &in_RDI->m_venv;
    sVar3 = std::vector<GrcEnv,_std::allocator<GrcEnv>_>::size(&in_RDI->m_venv);
    local_a8 = std::vector<GrcEnv,_std::allocator<GrcEnv>_>::operator[](this_02,sVar3 - 1);
    local_b0 = GrcEnv::Table(local_a8);
    local_b4 = GrcEnv::Pass(local_a8);
    std::pair<GrcSymbolTableEntry_*,_int>::pair<GrcSymbolTableEntry_*,_int,_true>(&local_c8);
    local_c8.first = local_b0;
    local_c8.second = local_b4;
    std::
    map<GrcSymbolTableEntry*,int,std::less<GrcSymbolTableEntry*>,std::allocator<std::pair<GrcSymbolTableEntry*const,int>>>
    ::insert<std::pair<GrcSymbolTableEntry*,int>&>
              ((map<GrcSymbolTableEntry_*,_int,_std::less<GrcSymbolTableEntry_*>,_std::allocator<std::pair<GrcSymbolTableEntry_*const,_int>_>_>
                *)in_RDI,(pair<GrcSymbolTableEntry_*,_int> *)in_stack_fffffffffffffed8);
    this_01 = PushEnvAux(this_00);
    GrcEnv::SetTable(this_01,local_28);
    iVar6 = 0;
    std::
    map<GrcSymbolTableEntry_*,_int,_std::less<GrcSymbolTableEntry_*>,_std::allocator<std::pair<GrcSymbolTableEntry_*const,_int>_>_>
    ::find((map<GrcSymbolTableEntry_*,_int,_std::less<GrcSymbolTableEntry_*>,_std::allocator<std::pair<GrcSymbolTableEntry_*const,_int>_>_>
            *)in_stack_fffffffffffffec8,(key_type *)0x1b7f63);
    std::
    map<GrcSymbolTableEntry_*,_int,_std::less<GrcSymbolTableEntry_*>,_std::allocator<std::pair<GrcSymbolTableEntry_*const,_int>_>_>
    ::end((map<GrcSymbolTableEntry_*,_int,_std::less<GrcSymbolTableEntry_*>,_std::allocator<std::pair<GrcSymbolTableEntry_*const,_int>_>_>
           *)in_stack_fffffffffffffec8);
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffff10,(_Self *)&stack0xffffffffffffff08);
    if (bVar1) {
      ppVar4 = std::_Rb_tree_iterator<std::pair<GrcSymbolTableEntry_*const,_int>_>::operator->
                         ((_Rb_tree_iterator<std::pair<GrcSymbolTableEntry_*const,_int>_> *)0x1b7f9d
                         );
      iVar6 = ppVar4->second;
    }
    GrcEnv::SetPass(this_01,iVar6);
    local_8 = this_01;
  }
  return local_8;
}

Assistant:

GrcEnv * GrcManager::PushTableEnv(GrpLineAndFile & lnf, std::string staTableName)
{
	Symbol psymTable = SymbolTable()->FindSymbol(staTableName);
	if (!psymTable || !psymTable->FitsSymbolType(ksymtTable))
	{
		g_errorList.AddError(1181, NULL,
			"Invalid table name: ",
			staTableName,
			lnf);
		return PushGeneralEnv(lnf);	// just push a copy of current env
	}
	else
	{
		GrcEnv * penvPrev = &(m_venv[m_venv.size() - 1]);
		Symbol psymPrevTable = penvPrev->Table();
		int nPrevPass = penvPrev->Pass();
		std::pair<Symbol, int> hmpair;
		hmpair.first = psymPrevTable;
		hmpair.second = nPrevPass;
		m_hmpsymnCurrPass.insert(hmpair);
		//m_hmpsymnCurrPass.Insert(psymPrevTable, nPrevPass, true);

		GrcEnv * penvNew = PushEnvAux();

		penvNew->SetTable(psymTable);
		int nPass = 0;
		std::map<Symbol, int>::iterator hmit = m_hmpsymnCurrPass.find(psymTable);
		if (hmit != m_hmpsymnCurrPass.end())
			nPass = hmit->second;
		//m_hmpsymnCurrPass.Retrieve(psymTable, &nPass);
		penvNew->SetPass(nPass);

		return penvNew;
	}
}